

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt tt_cmap8_char_index(TT_CMap cmap,FT_UInt32 char_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  uint uVar3;
  FT_UInt32 start_id;
  FT_UInt32 end;
  FT_UInt32 start;
  FT_UInt32 num_groups;
  FT_Byte *p;
  FT_UInt result;
  FT_Byte *table;
  FT_UInt32 char_code_local;
  TT_CMap cmap_local;
  
  pFVar1 = cmap->data;
  end = (uint)pFVar1[0x200c] << 0x18 | (uint)pFVar1[0x200d] << 0x10 | (uint)pFVar1[0x200e] << 8 |
        (uint)pFVar1[0x200f];
  _start = pFVar1 + 0x2010;
  while( true ) {
    if (end == 0) {
      return 0;
    }
    uVar2 = (uint)*_start << 0x18 | (uint)_start[1] << 0x10 | (uint)_start[2] << 8 | (uint)_start[3]
    ;
    uVar3 = (uint)_start[8] << 0x18 | (uint)_start[9] << 0x10 | (uint)_start[10] << 8 |
            (uint)_start[0xb];
    if (char_code < uVar2) break;
    if (char_code <=
        ((uint)_start[4] << 0x18 | (uint)_start[5] << 0x10 | (uint)_start[6] << 8 | (uint)_start[7])
       ) {
      if ((ulong)uVar3 <= 0xffffffff - (ulong)(char_code - uVar2)) {
        return uVar3 + (char_code - uVar2);
      }
      return 0;
    }
    end = end - 1;
    _start = _start + 0xc;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap8_char_index( TT_CMap    cmap,
                       FT_UInt32  char_code )
  {
    FT_Byte*   table      = cmap->data;
    FT_UInt    result     = 0;
    FT_Byte*   p          = table + 8204;
    FT_UInt32  num_groups = TT_NEXT_ULONG( p );
    FT_UInt32  start, end, start_id;


    for ( ; num_groups > 0; num_groups-- )
    {
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      start_id = TT_NEXT_ULONG( p );

      if ( char_code < start )
        break;

      if ( char_code <= end )
      {
        if ( start_id > 0xFFFFFFFFUL - ( char_code - start ) )
          return 0;

        result = (FT_UInt)( start_id + ( char_code - start ) );
        break;
      }
    }
    return result;
  }